

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O2

Result emulator_read_ext_ram(Emulator *e,FileData *file_data)

{
  Result RVar1;
  
  RVar1 = OK;
  if ((e->state).ext_ram.battery_type == BATTERY_TYPE_WITH_BATTERY) {
    if (file_data->size == (e->state).ext_ram.size) {
      memcpy(&(e->state).ext_ram,file_data->data,file_data->size);
    }
    else {
      fprintf(_stderr,"%s:%d: ",
              "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/emulator.c",
              0x1366);
      fprintf(_stderr,"save file is wrong size: %ld, expected %ld.\n",file_data->size,
              (e->state).ext_ram.size);
      RVar1 = ERROR;
    }
  }
  return RVar1;
}

Assistant:

Result emulator_read_ext_ram(Emulator* e, const FileData* file_data) {
  if (EXT_RAM.battery_type != BATTERY_TYPE_WITH_BATTERY)
    return OK;

  CHECK_MSG(file_data->size == EXT_RAM.size,
            "save file is wrong size: %ld, expected %ld.\n",
            (long)file_data->size, (long)EXT_RAM.size);
  memcpy(EXT_RAM.data, file_data->data, file_data->size);
  return OK;
  ON_ERROR_RETURN;
}